

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_sse42_intr.c
# Opt level: O0

void ihevc_itrans_recon_4x4_ttype1_sse42
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong *puVar35;
  undefined4 *puVar36;
  undefined4 *in_RCX;
  ulong *in_RDX;
  ulong *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i m_temp_reg_34;
  __m128i m_temp_reg_33;
  __m128i m_temp_reg_32;
  __m128i m_temp_reg_31;
  __m128i m_temp_reg_30;
  __m128i m_temp_reg_25;
  __m128i m_temp_reg_24;
  __m128i m_temp_reg_23;
  __m128i m_temp_reg_22;
  __m128i m_temp_reg_21;
  __m128i m_temp_reg_20;
  __m128i m_temp_reg_14;
  __m128i m_temp_reg_13;
  __m128i m_temp_reg_12;
  __m128i m_temp_reg_11;
  __m128i m_temp_reg_10;
  __m128i m_temp_reg_4;
  __m128i m_temp_reg_3;
  __m128i m_temp_reg_2;
  __m128i m_temp_reg_1;
  __m128i m_temp_reg_0;
  undefined1 local_d08 [16];
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  undefined1 local_cd8 [16];
  undefined1 local_c68 [16];
  undefined1 local_c58 [16];
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  undefined4 local_a48;
  undefined4 uStack_a44;
  undefined4 uStack_a40;
  undefined4 uStack_a3c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined4 local_a08;
  undefined4 uStack_a04;
  undefined4 uStack_a00;
  undefined4 uStack_9fc;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_988;
  undefined4 uStack_984;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined8 local_4e8;
  undefined8 local_4a8;
  undefined4 uStack_424;
  undefined4 uStack_414;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined4 uStack_13c;
  undefined4 uStack_12c;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  WORD32 *pi4_dst;
  WORD32 i4_shift;
  __m128i m_count;
  __m128i m_rdng_factor;
  __m128i m_coeff3;
  __m128i m_coeff2;
  __m128i m_coeff1;
  __m128i m_temp_reg_36;
  __m128i m_temp_reg_35;
  
  local_c38._8_8_ = 0;
  local_c38._0_8_ = *in_RDI;
  puVar35 = (ulong *)((long)in_RDI + (long)in_R8D * 2);
  local_c48._0_8_ = *puVar35;
  local_c48._8_8_ = 0;
  puVar35 = (ulong *)((long)puVar35 + (long)in_R8D * 2);
  local_c58._0_8_ = *puVar35;
  local_c58._8_8_ = 0;
  local_c68._0_8_ = *(ulong *)((long)puVar35 + (long)in_R8D * 2);
  local_c68._8_8_ = 0;
  auVar37 = pmovsxwd(local_c38,*in_RDI);
  auVar38 = pmovsxwd(local_c58,local_c58._0_8_);
  auVar39 = pmovsxwd(local_c48,local_c48._0_8_);
  auVar40 = pmovsxwd(local_c68,local_c68._0_8_);
  local_978 = auVar37._0_4_;
  uStack_974 = auVar37._4_4_;
  uStack_970 = auVar37._8_4_;
  uStack_96c = auVar37._12_4_;
  local_988 = auVar38._0_4_;
  uStack_984 = auVar38._4_4_;
  uStack_980 = auVar38._8_4_;
  uStack_97c = auVar38._12_4_;
  auVar18._8_4_ = 0x4a;
  auVar18._12_4_ = 0x4a;
  auVar18._0_4_ = 0x4a;
  auVar18._4_4_ = 0x4a;
  auVar37 = pmulld(auVar39,auVar18);
  local_528 = auVar40._0_4_;
  uStack_524 = auVar40._4_4_;
  uStack_520 = auVar40._8_4_;
  uStack_51c = auVar40._12_4_;
  auVar17._4_4_ = uStack_974 + uStack_984;
  auVar17._0_4_ = local_978 + local_988;
  auVar17._12_4_ = uStack_96c + uStack_97c;
  auVar17._8_4_ = uStack_970 + uStack_980;
  auVar16._8_4_ = 0x1d;
  auVar16._12_4_ = 0x1d;
  auVar16._0_4_ = 0x1d;
  auVar16._4_4_ = 0x1d;
  auVar38 = pmulld(auVar17,auVar16);
  auVar15._4_4_ = uStack_984 + uStack_524;
  auVar15._0_4_ = local_988 + local_528;
  auVar15._12_4_ = uStack_97c + uStack_51c;
  auVar15._8_4_ = uStack_980 + uStack_520;
  auVar14._8_4_ = 0x37;
  auVar14._12_4_ = 0x37;
  auVar14._0_4_ = 0x37;
  auVar14._4_4_ = 0x37;
  auVar39 = pmulld(auVar15,auVar14);
  auVar13._4_4_ = uStack_984 + uStack_524;
  auVar13._0_4_ = local_988 + local_528;
  auVar13._12_4_ = uStack_97c + uStack_51c;
  auVar13._8_4_ = uStack_980 + uStack_520;
  auVar12._8_4_ = 0x1d;
  auVar12._12_4_ = 0x1d;
  auVar12._0_4_ = 0x1d;
  auVar12._4_4_ = 0x1d;
  auVar40 = pmulld(auVar13,auVar12);
  auVar11._4_4_ = uStack_974 - uStack_524;
  auVar11._0_4_ = local_978 - local_528;
  auVar11._12_4_ = uStack_96c - uStack_51c;
  auVar11._8_4_ = uStack_970 - uStack_520;
  auVar10._8_4_ = 0x37;
  auVar10._12_4_ = 0x37;
  auVar10._0_4_ = 0x37;
  auVar10._4_4_ = 0x37;
  auVar41 = pmulld(auVar11,auVar10);
  auVar9._4_4_ = uStack_974 + uStack_984;
  auVar9._0_4_ = local_978 + local_988;
  auVar9._12_4_ = uStack_96c + uStack_97c;
  auVar9._8_4_ = uStack_970 + uStack_980;
  auVar8._8_4_ = 0x37;
  auVar8._12_4_ = 0x37;
  auVar8._0_4_ = 0x37;
  auVar8._4_4_ = 0x37;
  auVar42 = pmulld(auVar9,auVar8);
  auVar7._4_4_ = uStack_974 - uStack_524;
  auVar7._0_4_ = local_978 - local_528;
  auVar7._12_4_ = uStack_96c - uStack_51c;
  auVar7._8_4_ = uStack_970 - uStack_520;
  auVar6._8_4_ = 0x1d;
  auVar6._12_4_ = 0x1d;
  auVar6._0_4_ = 0x1d;
  auVar6._4_4_ = 0x1d;
  auVar43 = pmulld(auVar7,auVar6);
  auVar5._4_4_ = (uStack_974 - uStack_984) + uStack_524;
  auVar5._0_4_ = (local_978 - local_988) + local_528;
  auVar5._12_4_ = (uStack_96c - uStack_97c) + uStack_51c;
  auVar5._8_4_ = (uStack_970 - uStack_980) + uStack_520;
  auVar4._8_4_ = 0x4a;
  auVar4._12_4_ = 0x4a;
  auVar4._0_4_ = 0x4a;
  auVar4._4_4_ = 0x4a;
  auVar44 = pmulld(auVar5,auVar4);
  local_4a8 = SUB168(ZEXT416(7),0);
  local_558 = auVar38._0_4_;
  uStack_554 = auVar38._4_4_;
  uStack_550 = auVar38._8_4_;
  uStack_54c = auVar38._12_4_;
  local_568 = auVar39._0_4_;
  uStack_564 = auVar39._4_4_;
  uStack_560 = auVar39._8_4_;
  uStack_55c = auVar39._12_4_;
  local_588 = auVar37._0_4_;
  uStack_584 = auVar37._4_4_;
  uStack_580 = auVar37._8_4_;
  uStack_57c = auVar37._12_4_;
  local_9b8 = auVar41._0_4_;
  uStack_9b4 = auVar41._4_4_;
  uStack_9b0 = auVar41._8_4_;
  uStack_9ac = auVar41._12_4_;
  local_9c8 = auVar40._0_4_;
  uStack_9c4 = auVar40._4_4_;
  uStack_9c0 = auVar40._8_4_;
  uStack_9bc = auVar40._12_4_;
  local_5d8 = auVar42._0_4_;
  uStack_5d4 = auVar42._4_4_;
  uStack_5d0 = auVar42._8_4_;
  uStack_5cc = auVar42._12_4_;
  local_5e8 = auVar43._0_4_;
  uStack_5e4 = auVar43._4_4_;
  uStack_5e0 = auVar43._8_4_;
  uStack_5dc = auVar43._12_4_;
  local_618 = auVar44._0_4_;
  uStack_614 = auVar44._4_4_;
  uStack_610 = auVar44._8_4_;
  uStack_60c = auVar44._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_4a8;
  local_cd8._4_4_ = uStack_554 + uStack_564 + uStack_584 + 0x40 >> auVar26;
  local_cd8._0_4_ = local_558 + local_568 + local_588 + 0x40 >> auVar26;
  local_cd8._8_4_ = uStack_550 + uStack_560 + uStack_580 + 0x40 >> auVar26;
  local_cd8._12_4_ = uStack_54c + uStack_55c + uStack_57c + 0x40 >> auVar26;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_4a8;
  local_ce8._4_4_ = (uStack_9b4 - uStack_9c4) + uStack_584 + 0x40 >> auVar25;
  local_ce8._0_4_ = (local_9b8 - local_9c8) + local_588 + 0x40 >> auVar25;
  local_ce8._8_4_ = (uStack_9b0 - uStack_9c0) + uStack_580 + 0x40 >> auVar25;
  local_ce8._12_4_ = (uStack_9ac - uStack_9bc) + uStack_57c + 0x40 >> auVar25;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_4a8;
  local_d08._4_4_ = uStack_5d4 + uStack_5e4 + (0x40 - uStack_584) >> auVar24;
  local_d08._0_4_ = local_5d8 + local_5e8 + (0x40 - local_588) >> auVar24;
  local_d08._8_4_ = uStack_5d0 + uStack_5e0 + (0x40 - uStack_580) >> auVar24;
  local_d08._12_4_ = uStack_5cc + uStack_5dc + (0x40 - uStack_57c) >> auVar24;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_4a8;
  local_cf8._4_4_ = uStack_614 + 0x40 >> auVar23;
  local_cf8._0_4_ = local_618 + 0x40 >> auVar23;
  local_cf8._8_4_ = uStack_610 + 0x40 >> auVar23;
  local_cf8._12_4_ = uStack_60c + 0x40 >> auVar23;
  auVar34._8_8_ = local_cd8._8_8_;
  auVar34._0_8_ = local_cd8._0_8_;
  auVar33._8_8_ = local_ce8._8_8_;
  auVar33._0_8_ = local_ce8._0_8_;
  auVar37 = packssdw(auVar34,auVar33);
  auVar32._8_8_ = local_cf8._8_8_;
  auVar32._0_8_ = local_cf8._0_8_;
  auVar31._8_8_ = local_d08._8_8_;
  auVar31._0_8_ = local_d08._0_8_;
  auVar38 = packssdw(auVar32,auVar31);
  local_178 = auVar37._0_2_;
  uStack_176 = auVar37._2_2_;
  uStack_174 = auVar37._4_2_;
  uStack_172 = auVar37._6_2_;
  local_188 = auVar37._8_2_;
  uStack_186 = auVar37._10_2_;
  uStack_184 = auVar37._12_2_;
  uStack_182 = auVar37._14_2_;
  local_198 = auVar38._0_2_;
  uStack_196 = auVar38._2_2_;
  uStack_194 = auVar38._4_2_;
  uStack_192 = auVar38._6_2_;
  local_1a8 = auVar38._8_2_;
  uStack_1a6 = auVar38._10_2_;
  uStack_1a4 = auVar38._12_2_;
  uStack_1a2 = auVar38._14_2_;
  uStack_414 = (undefined4)
               (CONCAT26(uStack_186,CONCAT24(uStack_176,CONCAT22(local_188,local_178))) >> 0x20);
  uStack_424 = (undefined4)
               (CONCAT26(uStack_1a6,CONCAT24(uStack_196,CONCAT22(local_1a8,local_198))) >> 0x20);
  local_cd8._4_4_ = CONCAT22(local_1a8,local_198);
  local_cd8._0_4_ = CONCAT22(local_188,local_178);
  local_cd8._8_4_ = uStack_414;
  local_cd8._12_4_ = uStack_424;
  uStack_12c = (undefined4)
               (CONCAT26(uStack_182,CONCAT24(uStack_172,CONCAT22(uStack_184,uStack_174))) >> 0x20);
  uStack_13c = (undefined4)
               (CONCAT26(uStack_1a2,CONCAT24(uStack_192,CONCAT22(uStack_1a4,uStack_194))) >> 0x20);
  local_ce8._4_4_ = CONCAT22(uStack_1a4,uStack_194);
  local_ce8._0_4_ = CONCAT22(uStack_184,uStack_174);
  local_ce8._8_4_ = uStack_12c;
  local_ce8._12_4_ = uStack_13c;
  local_cf8._8_8_ = 0;
  local_cf8._0_8_ = local_cd8._8_8_;
  auVar37 = pmovsxwd(local_cd8,local_cd8._0_8_);
  local_d08._8_8_ = 0;
  local_d08._0_8_ = local_ce8._8_8_;
  auVar38 = pmovsxwd(local_ce8,local_ce8._0_8_);
  auVar39 = pmovsxwd(local_cf8,local_cd8._8_8_);
  auVar40 = pmovsxwd(local_d08,local_ce8._8_8_);
  local_9f8 = auVar37._0_4_;
  uStack_9f4 = auVar37._4_4_;
  uStack_9f0 = auVar37._8_4_;
  uStack_9ec = auVar37._12_4_;
  local_a08 = auVar38._0_4_;
  uStack_a04 = auVar38._4_4_;
  uStack_a00 = auVar38._8_4_;
  uStack_9fc = auVar38._12_4_;
  auVar45._8_4_ = 0x4a;
  auVar45._12_4_ = 0x4a;
  auVar45._0_4_ = 0x4a;
  auVar45._4_4_ = 0x4a;
  auVar45 = pmulld(auVar39,auVar45);
  local_c38._4_4_ = uStack_9f4 + uStack_a04;
  local_c38._0_4_ = local_9f8 + local_a08;
  local_c38._8_4_ = uStack_9f0 + uStack_a00;
  local_c38._12_4_ = uStack_9ec + uStack_9fc;
  local_658 = auVar40._0_4_;
  uStack_654 = auVar40._4_4_;
  uStack_650 = auVar40._8_4_;
  uStack_64c = auVar40._12_4_;
  local_c48._4_4_ = uStack_654 + uStack_a04;
  local_c48._0_4_ = local_658 + local_a08;
  local_c48._8_4_ = uStack_650 + uStack_a00;
  local_c48._12_4_ = uStack_64c + uStack_9fc;
  local_c58._4_4_ = uStack_9f4 - uStack_654;
  local_c58._0_4_ = local_9f8 - local_658;
  local_c58._8_4_ = uStack_9f0 - uStack_650;
  local_c58._12_4_ = uStack_9ec - uStack_64c;
  auVar3._8_8_ = local_c38._8_8_;
  auVar3._0_8_ = local_c38._0_8_;
  auVar46._8_4_ = 0x1d;
  auVar46._12_4_ = 0x1d;
  auVar46._0_4_ = 0x1d;
  auVar46._4_4_ = 0x1d;
  auVar46 = pmulld(auVar3,auVar46);
  auVar2._8_8_ = local_c48._8_8_;
  auVar2._0_8_ = local_c48._0_8_;
  auVar47._8_4_ = 0x37;
  auVar47._12_4_ = 0x37;
  auVar47._0_4_ = 0x37;
  auVar47._4_4_ = 0x37;
  auVar47 = pmulld(auVar2,auVar47);
  auVar1._8_8_ = local_c48._8_8_;
  auVar1._0_8_ = local_c48._0_8_;
  auVar48._8_4_ = 0x1d;
  auVar48._12_4_ = 0x1d;
  auVar48._0_4_ = 0x1d;
  auVar48._4_4_ = 0x1d;
  auVar48 = pmulld(auVar1,auVar48);
  auVar44._8_8_ = local_c58._8_8_;
  auVar44._0_8_ = local_c58._0_8_;
  auVar43._8_4_ = 0x37;
  auVar43._12_4_ = 0x37;
  auVar43._0_4_ = 0x37;
  auVar43._4_4_ = 0x37;
  auVar43 = pmulld(auVar44,auVar43);
  auVar42._8_8_ = local_c38._8_8_;
  auVar42._0_8_ = local_c38._0_8_;
  auVar41._8_4_ = 0x37;
  auVar41._12_4_ = 0x37;
  auVar41._0_4_ = 0x37;
  auVar41._4_4_ = 0x37;
  auVar41 = pmulld(auVar42,auVar41);
  auVar40._8_8_ = local_c58._8_8_;
  auVar40._0_8_ = local_c58._0_8_;
  auVar39._8_4_ = 0x1d;
  auVar39._12_4_ = 0x1d;
  auVar39._0_4_ = 0x1d;
  auVar39._4_4_ = 0x1d;
  auVar39 = pmulld(auVar40,auVar39);
  auVar38._4_4_ = (uStack_9f4 - uStack_a04) + uStack_654;
  auVar38._0_4_ = (local_9f8 - local_a08) + local_658;
  auVar38._12_4_ = (uStack_9ec - uStack_9fc) + uStack_64c;
  auVar38._8_4_ = (uStack_9f0 - uStack_a00) + uStack_650;
  auVar37._8_4_ = 0x4a;
  auVar37._12_4_ = 0x4a;
  auVar37._0_4_ = 0x4a;
  auVar37._4_4_ = 0x4a;
  auVar37 = pmulld(auVar38,auVar37);
  local_4e8 = SUB168(ZEXT416(0xc),0);
  local_6a8 = auVar45._0_4_;
  uStack_6a4 = auVar45._4_4_;
  uStack_6a0 = auVar45._8_4_;
  uStack_69c = auVar45._12_4_;
  local_6b8 = auVar46._0_4_;
  uStack_6b4 = auVar46._4_4_;
  uStack_6b0 = auVar46._8_4_;
  uStack_6ac = auVar46._12_4_;
  local_6c8 = auVar47._0_4_;
  uStack_6c4 = auVar47._4_4_;
  uStack_6c0 = auVar47._8_4_;
  uStack_6bc = auVar47._12_4_;
  local_a38 = auVar43._0_4_;
  uStack_a34 = auVar43._4_4_;
  uStack_a30 = auVar43._8_4_;
  uStack_a2c = auVar43._12_4_;
  local_a48 = auVar48._0_4_;
  uStack_a44 = auVar48._4_4_;
  uStack_a40 = auVar48._8_4_;
  uStack_a3c = auVar48._12_4_;
  local_718 = auVar41._0_4_;
  uStack_714 = auVar41._4_4_;
  uStack_710 = auVar41._8_4_;
  uStack_70c = auVar41._12_4_;
  local_728 = auVar39._0_4_;
  uStack_724 = auVar39._4_4_;
  uStack_720 = auVar39._8_4_;
  uStack_71c = auVar39._12_4_;
  local_758 = auVar37._0_4_;
  uStack_754 = auVar37._4_4_;
  uStack_750 = auVar37._8_4_;
  uStack_74c = auVar37._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_4e8;
  local_cd8._4_4_ = uStack_6b4 + uStack_6c4 + uStack_6a4 + 0x800 >> auVar22;
  local_cd8._0_4_ = local_6b8 + local_6c8 + local_6a8 + 0x800 >> auVar22;
  local_cd8._8_4_ = uStack_6b0 + uStack_6c0 + uStack_6a0 + 0x800 >> auVar22;
  local_cd8._12_4_ = uStack_6ac + uStack_6bc + uStack_69c + 0x800 >> auVar22;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_4e8;
  local_ce8._4_4_ = (uStack_a34 - uStack_a44) + uStack_6a4 + 0x800 >> auVar21;
  local_ce8._0_4_ = (local_a38 - local_a48) + local_6a8 + 0x800 >> auVar21;
  local_ce8._8_4_ = (uStack_a30 - uStack_a40) + uStack_6a0 + 0x800 >> auVar21;
  local_ce8._12_4_ = (uStack_a2c - uStack_a3c) + uStack_69c + 0x800 >> auVar21;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_4e8;
  local_d08._4_4_ = uStack_714 + uStack_724 + (0x800 - uStack_6a4) >> auVar20;
  local_d08._0_4_ = local_718 + local_728 + (0x800 - local_6a8) >> auVar20;
  local_d08._8_4_ = uStack_710 + uStack_720 + (0x800 - uStack_6a0) >> auVar20;
  local_d08._12_4_ = uStack_70c + uStack_71c + (0x800 - uStack_69c) >> auVar20;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_4e8;
  local_cf8._4_4_ = uStack_754 + 0x800 >> auVar19;
  local_cf8._0_4_ = local_758 + 0x800 >> auVar19;
  local_cf8._8_4_ = uStack_750 + 0x800 >> auVar19;
  local_cf8._12_4_ = uStack_74c + 0x800 >> auVar19;
  auVar30._8_8_ = local_cd8._8_8_;
  auVar30._0_8_ = local_cd8._0_8_;
  auVar29._8_8_ = local_ce8._8_8_;
  auVar29._0_8_ = local_ce8._0_8_;
  auVar37 = packssdw(auVar30,auVar29);
  auVar28._8_8_ = local_cf8._8_8_;
  auVar28._0_8_ = local_cf8._0_8_;
  auVar27._8_8_ = local_d08._8_8_;
  auVar27._0_8_ = local_d08._0_8_;
  auVar38 = packssdw(auVar28,auVar27);
  local_1b8 = auVar37._0_2_;
  uStack_1b6 = auVar37._2_2_;
  uStack_1b4 = auVar37._4_2_;
  uStack_1b2 = auVar37._6_2_;
  local_1c8 = auVar37._8_2_;
  uStack_1c6 = auVar37._10_2_;
  uStack_1c4 = auVar37._12_2_;
  uStack_1c2 = auVar37._14_2_;
  local_1d8 = auVar38._0_2_;
  uStack_1d6 = auVar38._2_2_;
  uStack_1d4 = auVar38._4_2_;
  uStack_1d2 = auVar38._6_2_;
  local_1e8 = auVar38._8_2_;
  uStack_1e6 = auVar38._10_2_;
  uStack_1e4 = auVar38._12_2_;
  uStack_1e2 = auVar38._14_2_;
  local_c38._8_8_ = 0;
  local_c38._0_8_ = *in_RDX;
  local_c48._0_8_ = *(ulong *)((long)in_RDX + (long)in_R9D);
  local_c48._8_8_ = 0;
  puVar35 = (ulong *)((long)in_RDX + (long)in_R9D + (long)in_R9D);
  local_c58._0_8_ = *puVar35;
  local_c58._8_8_ = 0;
  local_c68._0_8_ = *(ulong *)((long)puVar35 + (long)in_R9D);
  local_c68._8_8_ = 0;
  auVar37 = pmovzxbw(local_c38,*in_RDX);
  auVar38 = pmovzxbw(local_c48,local_c48._0_8_);
  auVar39 = pmovzxbw(local_c58,local_c58._0_8_);
  auVar40 = pmovzxbw(local_c68,local_c68._0_8_);
  local_c8 = auVar37._0_2_;
  uStack_c6 = auVar37._2_2_;
  uStack_c4 = auVar37._4_2_;
  uStack_c2 = auVar37._6_2_;
  uStack_c0 = auVar38._0_2_;
  uStack_be = auVar38._2_2_;
  uStack_bc = auVar38._4_2_;
  uStack_ba = auVar38._6_2_;
  local_1b8 = local_1b8 + local_c8;
  local_1c8 = local_1c8 + uStack_c6;
  local_1d8 = local_1d8 + uStack_c4;
  local_1e8 = local_1e8 + uStack_c2;
  uStack_1b6 = uStack_1b6 + uStack_c0;
  uStack_1c6 = uStack_1c6 + uStack_be;
  uStack_1d6 = uStack_1d6 + uStack_bc;
  uStack_1e6 = uStack_1e6 + uStack_ba;
  local_e8 = auVar39._0_2_;
  uStack_e6 = auVar39._2_2_;
  uStack_e4 = auVar39._4_2_;
  uStack_e2 = auVar39._6_2_;
  uStack_e0 = auVar40._0_2_;
  uStack_de = auVar40._2_2_;
  uStack_dc = auVar40._4_2_;
  uStack_da = auVar40._6_2_;
  uStack_1b4 = uStack_1b4 + local_e8;
  uStack_1c4 = uStack_1c4 + uStack_e6;
  uStack_1d4 = uStack_1d4 + uStack_e4;
  uStack_1e4 = uStack_1e4 + uStack_e2;
  uStack_1b2 = uStack_1b2 + uStack_e0;
  uStack_1c2 = uStack_1c2 + uStack_de;
  uStack_1d2 = uStack_1d2 + uStack_dc;
  uStack_1e2 = uStack_1e2 + uStack_da;
  local_c38[1] = (0 < local_1c8) * (local_1c8 < 0x100) * (char)local_1c8 - (0xff < local_1c8);
  local_c38[0] = (0 < local_1b8) * (local_1b8 < 0x100) * (char)local_1b8 - (0xff < local_1b8);
  local_c38[2] = (0 < local_1d8) * (local_1d8 < 0x100) * (char)local_1d8 - (0xff < local_1d8);
  local_c38[3] = (0 < local_1e8) * (local_1e8 < 0x100) * (char)local_1e8 - (0xff < local_1e8);
  local_c38[4] = (0 < uStack_1b6) * (uStack_1b6 < 0x100) * (char)uStack_1b6 - (0xff < uStack_1b6);
  local_c38[5] = (0 < uStack_1c6) * (uStack_1c6 < 0x100) * (char)uStack_1c6 - (0xff < uStack_1c6);
  local_c38[6] = (0 < uStack_1d6) * (uStack_1d6 < 0x100) * (char)uStack_1d6 - (0xff < uStack_1d6);
  local_c38[7] = (0 < uStack_1e6) * (uStack_1e6 < 0x100) * (char)uStack_1e6 - (0xff < uStack_1e6);
  local_c38[8] = (0 < uStack_1b4) * (uStack_1b4 < 0x100) * (char)uStack_1b4 - (0xff < uStack_1b4);
  local_c38[9] = (0 < uStack_1c4) * (uStack_1c4 < 0x100) * (char)uStack_1c4 - (0xff < uStack_1c4);
  local_c38[10] = (0 < uStack_1d4) * (uStack_1d4 < 0x100) * (char)uStack_1d4 - (0xff < uStack_1d4);
  local_c38[0xb] = (0 < uStack_1e4) * (uStack_1e4 < 0x100) * (char)uStack_1e4 - (0xff < uStack_1e4);
  local_c38[0xc] = (0 < uStack_1b2) * (uStack_1b2 < 0x100) * (char)uStack_1b2 - (0xff < uStack_1b2);
  local_c38[0xd] = (0 < uStack_1c2) * (uStack_1c2 < 0x100) * (char)uStack_1c2 - (0xff < uStack_1c2);
  local_c38[0xe] = (0 < uStack_1d2) * (uStack_1d2 < 0x100) * (char)uStack_1d2 - (0xff < uStack_1d2);
  local_c38[0xf] = (0 < uStack_1e2) * (uStack_1e2 < 0x100) * (char)uStack_1e2 - (0xff < uStack_1e2);
  *in_RCX = local_c38._0_4_;
  m_coeff3[1]._0_4_ = SUB84(local_c38._0_8_,4);
  *(undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_34[1]) = (undefined4)m_coeff3[1];
  puVar36 = (undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_34[1] + (long)(int)m_temp_reg_34[1])
  ;
  m_count[1]._0_4_ = local_c38._8_4_;
  *puVar36 = (undefined4)m_count[1];
  *(int *)((long)puVar36 + (long)(int)m_temp_reg_34[1]) = local_c38._12_4_;
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1_sse42(WORD16 *pi2_src,
                                         WORD16 *pi2_tmp,
                                         UWORD8 *pu1_pred,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 pred_strd,
                                         WORD32 dst_strd,
                                         WORD32 zero_cols,
                                         WORD32 zero_rows)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_32;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_temp_reg_35;
    __m128i m_temp_reg_36;
    __m128i m_coeff1, m_coeff2, m_coeff3;
    __m128i m_rdng_factor;
    __m128i m_count;

    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_rows);
    UNUSED(zero_cols);
    UNUSED(pi2_tmp);

    m_coeff3 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[2][0]); //74

    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[3] in m_temp_reg_13 */
    {
        m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3);
    }

    /* c[0] in m_temp_reg_10 */
    {
        m_temp_reg_10 = _mm_add_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[1] in m_temp_reg_11 */
    {
        m_temp_reg_11 = _mm_add_epi32(m_temp_reg_2, m_temp_reg_3);
    }

    /* c[2] in m_temp_reg_12 */
    {
        m_temp_reg_12 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_3);
    }

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_3);
    }

    m_coeff1 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[1][0]); //29
    m_coeff2 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype1[0][0]); //55

    /* Stage 1 outputs stored in m_temp_reg_20-23 */
    {
        m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_10, m_coeff1); //29*c0
        m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_11, m_coeff2); //55*c1

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_11, m_coeff1); //29*c1
        m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_12, m_coeff2); //55*c2

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_10, m_coeff2); //55*c0
        m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_12, m_coeff1); //29*c2
        m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_14, m_coeff3); //74*c4

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
        m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

        m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
        m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

        m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);

    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);
        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[3] stored in m_temp_reg_3 */
        {
            m_temp_reg_3 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3);
        }

        /* c[0] stored in m_temp_reg_0 */
        {
            m_temp_reg_0 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[1] stored in m_temp_reg_1 */
        {
            m_temp_reg_1 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_21);
        }

        /* c[2] stored in m_temp_reg_2 */
        {
            m_temp_reg_2 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_23);
        }

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_add_epi32(m_temp_reg_4, m_temp_reg_23);
        }

        /* Stage 2 output generation */
        {
            m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_0, m_coeff1); //29*c0
            m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_1, m_coeff2); //55*c1

            m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

            m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1); //29*c1
            m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_2, m_coeff2); //55*c2

            m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

            m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_0, m_coeff2); //55*c0
            m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_2, m_coeff1); //29*c2
            m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_4, m_coeff3); //74*c4

            m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
            m_count = _mm_cvtsi32_si128(i4_shift);

            m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

            m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

            m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

            m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            WORD32 *pi4_dst = (WORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);
            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}